

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O1

int __thiscall QtMWidgets::ProgressBarPrivate::init(ProgressBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  ColorGroup CVar2;
  int iVar3;
  long *plVar4;
  QVariantAnimation *pQVar5;
  QVariant QStack_38;
  
  CVar2 = QWidget::palette();
  plVar4 = (long *)QPalette::brush(CVar2,Dark);
  uVar1 = *(undefined8 *)(*plVar4 + 0xe);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)(*plVar4 + 8);
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = uVar1;
  CVar2 = QWidget::palette();
  plVar4 = (long *)QPalette::brush(CVar2,Dark);
  uVar1 = *(undefined8 *)(*plVar4 + 0xe);
  *(undefined8 *)&this->grooveColor = *(undefined8 *)(*plVar4 + 8);
  *(undefined8 *)((long)&(this->grooveColor).ct + 2) = uVar1;
  CVar2 = QWidget::palette();
  plVar4 = (long *)QPalette::brush(CVar2,Dark);
  uVar1 = *(undefined8 *)(*plVar4 + 0xe);
  *(undefined8 *)&this->animationColor = *(undefined8 *)(*plVar4 + 8);
  *(undefined8 *)((long)&(this->animationColor).ct + 2) = uVar1;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  pQVar5 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar5,(QObject *)this->q);
  this->animation = pQVar5;
  QVariantAnimation::setDuration((int)pQVar5);
  QAbstractAnimation::setLoopCount((int)this->animation);
  pQVar5 = this->animation;
  QVariant::QVariant(&QStack_38,0.0);
  QVariantAnimation::setStartValue((QVariant *)pQVar5);
  QVariant::~QVariant(&QStack_38);
  pQVar5 = this->animation;
  QVariant::QVariant(&QStack_38,1.0);
  QVariantAnimation::setEndValue((QVariant *)pQVar5);
  QVariant::~QVariant(&QStack_38);
  iVar3 = QAbstractAnimation::start(this->animation,0);
  return iVar3;
}

Assistant:

void
ProgressBarPrivate::init()
{
	highlightColor = q->palette().color( QPalette::Highlight );
	grooveColor = q->palette().color( QPalette::Dark );
	animationColor = q->palette().color( QPalette::Base );

	QSizePolicy sp( QSizePolicy::Expanding, QSizePolicy::Fixed );
	if( orientation == Qt::Vertical )
		sp.transpose();

	q->setSizePolicy( sp );

	animation = new QVariantAnimation( q );
	animation->setDuration( 500 );
	animation->setLoopCount( -1 );
	animation->setStartValue( 0.0 );
	animation->setEndValue( 1.0 );
	animation->start();
}